

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  istream *piVar1;
  bool bVar2;
  double value;
  ValueHolder local_200 [2];
  undefined1 local_1f0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  IStringStream is;
  
  local_200[0].string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&is,(string *)&local_200[0].bool_,_S_in);
  std::__cxx11::string::~string((string *)&local_200[0].bool_);
  piVar1 = std::istream::_M_extract<double>((double *)&is);
  bVar2 = ((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0;
  if (bVar2) {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,token->start_,token->end_);
    std::operator+(&local_1b8,"\'",&local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   &local_1b8,"\' is not a number.");
    addError(this,(String *)local_200,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_200[0].bool_);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else {
    Value::Value((Value *)local_200,0.0);
    Value::operator=(decoded,(Value *)local_200);
    Value::~Value((Value *)local_200);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return !bVar2;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  IStringStream is(String(token.start_, token.end_));
  if (!(is >> value)) {
    if (value == std::numeric_limits<double>::max())
      value = std::numeric_limits<double>::infinity();
    else if (value == std::numeric_limits<double>::lowest())
      value = -std::numeric_limits<double>::infinity();
    else if (!std::isinf(value))
      return addError(
          "'" + String(token.start_, token.end_) + "' is not a number.", token);
  }
  decoded = value;
  return true;
}